

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O0

int dic_find(dictionary *dic,void *key,int keyn)

{
  uint32_t uVar1;
  int iVar2;
  keynode *local_30;
  keynode *k;
  int n;
  int keyn_local;
  void *key_local;
  dictionary *dic_local;
  
  uVar1 = meiyan((char *)key,keyn);
  local_30 = dic->table[(int)(uVar1 % (uint)dic->length)];
  if (local_30 != (keynode *)0x0) {
    for (; local_30 != (keynode *)0x0; local_30 = local_30->next) {
      if (((uint)local_30->len == keyn) &&
         (iVar2 = memcmp(local_30->key,key,(long)keyn), iVar2 == 0)) {
        dic->value = &local_30->value;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int dic_find(struct dictionary* dic, void *key, int keyn) {
	int n = hash_func((const char*)key, keyn) % dic->length;
	__builtin_prefetch(dic->table[n]);
	struct keynode *k = dic->table[n];
	if (!k) return 0;
	while (k) {
		if (k->len == keyn && !memcmp(k->key, key, keyn)) {
			dic->value = &k->value;
			return 1;
		}
		k = k->next;
	}
	return 0;
}